

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

void __thiscall mpt::slice::slice(slice *this,slice *from)

{
  content *pcVar1;
  long lVar2;
  content *pcVar3;
  
  array::array(&this->super_array,&from->super_array);
  this->_off = 0;
  this->_len = 0;
  pcVar3 = (from->super_array)._buf._ref;
  if (pcVar3 != (this->super_array)._buf._ref) {
    if (pcVar3 == (content *)0x0) {
      pcVar3 = (content *)0x0;
    }
    else {
      lVar2 = (**(code **)(*(long *)pcVar3 + 0x10))(pcVar3);
      if (lVar2 == 0) {
        pcVar3 = (content *)0x0;
      }
    }
    pcVar1 = (this->super_array)._buf._ref;
    if (pcVar1 != (content *)0x0) {
      (**(code **)(*(long *)pcVar1 + 8))();
    }
    (this->super_array)._buf._ref = pcVar3;
  }
  if ((this->super_array)._buf._ref != (content *)0x0) {
    this->_len = from->_len;
    this->_off = from->_off;
  }
  return;
}

Assistant:

slice::slice(slice const& from) : array(from), _off(0), _len(0)
{
	_buf = from._buf;
	if (!_buf.instance()) {
		return;
	}
	_len = from._len;
	_off = from._off;
}